

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_create_panel(nk_context *ctx)

{
  nk_page_element *__s;
  ulong uVar1;
  ulong uVar2;
  nk_page_element *__s_00;
  
  __s = nk_create_page_element(ctx);
  if (__s == (nk_page_element *)0x0) {
    __s = (nk_page_element *)0x0;
  }
  else {
    uVar1 = (ulong)__s & 3;
    if (uVar1 == 0) {
      uVar2 = 0x1c8;
      __s_00 = __s;
    }
    else {
      memset(__s,0,4 - uVar1);
      uVar2 = uVar1 | 0x1c4;
      __s_00 = (nk_page_element *)((long)__s + (4 - uVar1));
    }
    uVar1 = (ulong)((uint)uVar2 & 0xfffffffc);
    memset(__s_00,0,uVar1);
    if ((uVar2 & 3) != 0) {
      memset((void *)((long)&__s_00->data + uVar1),0,uVar2 & 3);
    }
  }
  return __s;
}

Assistant:

NK_INTERN void*
nk_create_panel(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    elem = nk_create_page_element(ctx);
    if (!elem) return 0;
    nk_zero_struct(*elem);
    return &elem->data.pan;
}